

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AbstractNumericFacetValidator.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::AbstractNumericFacetValidator::inspectFacetBase
          (AbstractNumericFacetValidator *this,MemoryManager *manager)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  AbstractNumericFacetValidator *this_00;
  XMLNumber *pXVar6;
  XMLNumber *pXVar7;
  XMLNumber *pXVar8;
  XMLNumber *pXVar9;
  XMLNumber *pXVar10;
  XMLNumber *pXVar11;
  XMLNumber *pXVar12;
  XMLNumber *pXVar13;
  InvalidDatatypeFacetException *pIVar14;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  XMLException *anon_var_0_5;
  XMLException *anon_var_0_4;
  int result_15;
  int result_14;
  int result_13;
  int result_12;
  int result_11;
  int result_10;
  int result_9;
  XMLException *anon_var_0_3;
  XMLException *anon_var_0_2;
  int result_8;
  int result_7;
  int result_6;
  int result_5;
  XMLException *anon_var_0_1;
  XMLException *anon_var_0;
  int result_4;
  int result_3;
  int result_2;
  int result_1;
  int result;
  int baseFixed;
  XMLNumber *baseMinExclusive;
  XMLNumber *baseMinInclusive;
  XMLNumber *baseMaxExclusive;
  XMLNumber *baseMaxInclusive;
  XMLNumber *thisMinExclusive;
  XMLNumber *thisMinInclusive;
  XMLNumber *thisMaxExclusive;
  XMLNumber *thisMaxInclusive;
  int baseFacetsDefined;
  int thisFacetsDefined;
  AbstractNumericFacetValidator *numBase;
  MemoryManager *manager_local;
  AbstractNumericFacetValidator *this_local;
  
  this_00 = (AbstractNumericFacetValidator *)
            DatatypeValidator::getBaseValidator(&this->super_DatatypeValidator);
  uVar1 = DatatypeValidator::getFacetsDefined(&this->super_DatatypeValidator);
  if (((uVar1 != 0) || (this->fEnumeration != (RefVectorOf<xercesc_4_0::XMLNumber> *)0x0)) &&
     (this_00 != (AbstractNumericFacetValidator *)0x0)) {
    uVar2 = DatatypeValidator::getFacetsDefined((DatatypeValidator *)this_00);
    pXVar6 = getMaxInclusive(this);
    pXVar7 = getMaxExclusive(this);
    pXVar8 = getMinInclusive(this);
    pXVar9 = getMinExclusive(this);
    pXVar10 = getMaxInclusive(this_00);
    pXVar11 = getMaxExclusive(this_00);
    pXVar12 = getMinInclusive(this_00);
    pXVar13 = getMinExclusive(this_00);
    uVar3 = DatatypeValidator::getFixed((DatatypeValidator *)this_00);
    if ((uVar1 & 0x20) != 0) {
      if ((uVar2 & 0x20) != 0) {
        iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                          (this,pXVar6,pXVar10);
        if (((uVar3 & 0x20) != 0) && (iVar4 != 0)) {
          pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar4 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[6])();
          iVar5 = (*(pXVar10->super_XSerializable)._vptr_XSerializable[6])();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (pIVar14,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,0x187,FACET_maxIncl_base_fixed,(XMLCh *)CONCAT44(extraout_var,iVar4),
                     (XMLCh *)CONCAT44(extraout_var_00,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
          __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                      InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
        }
        if ((iVar4 == 1) || (iVar4 == 2)) {
          pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar4 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[6])();
          iVar5 = (*(pXVar10->super_XSerializable)._vptr_XSerializable[6])();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (pIVar14,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,399,FACET_maxIncl_base_maxIncl,(XMLCh *)CONCAT44(extraout_var_01,iVar4),
                     (XMLCh *)CONCAT44(extraout_var_02,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
          __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                      InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
        }
      }
      if (((uVar2 & 0x40) != 0) &&
         (iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                            (this,pXVar6,pXVar11), iVar4 != -1)) {
        pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar4 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[6])();
        iVar5 = (*(pXVar11->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar14,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x19c,FACET_maxIncl_base_maxExcl,(XMLCh *)CONCAT44(extraout_var_03,iVar4),
                   (XMLCh *)CONCAT44(extraout_var_04,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      if (((uVar2 & 0x80) != 0) &&
         ((iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar6,pXVar12), iVar4 == -1 || (iVar4 == 2)))) {
        pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar4 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[6])();
        iVar5 = (*(pXVar12->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar14,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x1a9,FACET_maxIncl_base_minIncl,(XMLCh *)CONCAT44(extraout_var_05,iVar4),
                   (XMLCh *)CONCAT44(extraout_var_06,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      if (((uVar2 & 0x100) != 0) &&
         (iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                            (this,pXVar6,pXVar13), iVar4 != 1)) {
        pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar4 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[6])();
        iVar5 = (*(pXVar13->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar14,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x1b5,FACET_maxIncl_base_minExcl,(XMLCh *)CONCAT44(extraout_var_07,iVar4),
                   (XMLCh *)CONCAT44(extraout_var_08,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
    }
    if ((uVar1 & 0x40) != 0) {
      if ((uVar2 & 0x40) == 0) {
        if ((uVar1 & 0x40) != 0) {
          iVar4 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])();
          (*(this_00->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x11])
                    (this_00,CONCAT44(extraout_var_14,iVar4),0,0,manager);
        }
      }
      else {
        iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                          (this,pXVar7,pXVar11);
        if (((uVar3 & 0x40) != 0) && (iVar4 != 0)) {
          pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar4 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[6])();
          iVar5 = (*(pXVar11->super_XSerializable)._vptr_XSerializable[6])();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (pIVar14,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,0x1cd,FACET_maxExcl_base_fixed,(XMLCh *)CONCAT44(extraout_var_09,iVar4),
                     (XMLCh *)CONCAT44(extraout_var_10,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
          __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                      InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
        }
        if ((iVar4 == 1) || (iVar4 == 2)) {
          pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar4 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[6])();
          iVar5 = (*(pXVar11->super_XSerializable)._vptr_XSerializable[6])();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (pIVar14,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,0x1d5,FACET_maxExcl_base_maxExcl,(XMLCh *)CONCAT44(extraout_var_11,iVar4),
                     (XMLCh *)CONCAT44(extraout_var_12,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
          __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                      InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
        }
        if ((iVar4 != 0) && ((uVar1 & 0x40) != 0)) {
          iVar4 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[5])();
          (*(this_00->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x11])
                    (this_00,CONCAT44(extraout_var_13,iVar4),0,0,manager);
        }
      }
      if (((uVar2 & 0x20) != 0) &&
         ((iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar7,pXVar10), iVar4 == 1 || (iVar4 == 2)))) {
        pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar4 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[6])();
        iVar5 = (*(pXVar10->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar14,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x1f9,FACET_maxExcl_base_maxIncl,(XMLCh *)CONCAT44(extraout_var_15,iVar4),
                   (XMLCh *)CONCAT44(extraout_var_16,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      if (((uVar2 & 0x100) != 0) &&
         (iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                            (this,pXVar7,pXVar13), iVar4 != 1)) {
        pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar4 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[6])();
        iVar5 = (*(pXVar13->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar14,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x205,FACET_maxExcl_base_minExcl,(XMLCh *)CONCAT44(extraout_var_17,iVar4),
                   (XMLCh *)CONCAT44(extraout_var_18,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      if (((uVar2 & 0x80) != 0) &&
         (iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                            (this,pXVar7,pXVar12), iVar4 != 1)) {
        pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar4 = (*(pXVar7->super_XSerializable)._vptr_XSerializable[6])();
        iVar5 = (*(pXVar12->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar14,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x211,FACET_maxExcl_base_minIncl,(XMLCh *)CONCAT44(extraout_var_19,iVar4),
                   (XMLCh *)CONCAT44(extraout_var_20,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
    }
    if ((uVar1 & 0x100) != 0) {
      if ((uVar2 & 0x100) == 0) {
        if ((uVar1 & 0x100) != 0) {
          iVar4 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[5])();
          (*(this_00->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x11])
                    (this_00,CONCAT44(extraout_var_26,iVar4),0,0,manager);
        }
      }
      else {
        iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                          (this,pXVar9,pXVar13);
        if (((uVar3 & 0x100) != 0) && (iVar4 != 0)) {
          pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar4 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[6])();
          iVar5 = (*(pXVar13->super_XSerializable)._vptr_XSerializable[6])();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (pIVar14,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,0x228,FACET_minExcl_base_fixed,(XMLCh *)CONCAT44(extraout_var_21,iVar4),
                     (XMLCh *)CONCAT44(extraout_var_22,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
          __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                      InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
        }
        if ((iVar4 == -1) || (iVar4 == 2)) {
          pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar4 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[6])();
          iVar5 = (*(pXVar13->super_XSerializable)._vptr_XSerializable[6])();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (pIVar14,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,0x230,FACET_minExcl_base_minExcl,(XMLCh *)CONCAT44(extraout_var_23,iVar4),
                     (XMLCh *)CONCAT44(extraout_var_24,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
          __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                      InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
        }
        if ((iVar4 != 0) && ((uVar1 & 0x100) != 0)) {
          iVar4 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[5])();
          (*(this_00->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x11])
                    (this_00,CONCAT44(extraout_var_25,iVar4),0,0,manager);
        }
      }
      if (((uVar2 & 0x20) != 0) &&
         ((iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar9,pXVar10), iVar4 == 1 || (iVar4 == 2)))) {
        pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar4 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[6])();
        iVar5 = (*(pXVar10->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar14,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x256,FACET_minExcl_base_maxIncl,(XMLCh *)CONCAT44(extraout_var_27,iVar4),
                   (XMLCh *)CONCAT44(extraout_var_28,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      if (((uVar2 & 0x80) != 0) &&
         ((iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar9,pXVar12), iVar4 == -1 || (iVar4 == 2)))) {
        pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar4 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[6])();
        iVar5 = (*(pXVar12->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar14,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x262,FACET_minExcl_base_minIncl,(XMLCh *)CONCAT44(extraout_var_29,iVar4),
                   (XMLCh *)CONCAT44(extraout_var_30,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      if (((uVar2 & 0x40) != 0) &&
         (iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                            (this,pXVar9,pXVar11), iVar4 != -1)) {
        pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar4 = (*(pXVar9->super_XSerializable)._vptr_XSerializable[6])();
        iVar5 = (*(pXVar11->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar14,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x26e,FACET_minExcl_base_maxExcl,(XMLCh *)CONCAT44(extraout_var_31,iVar4),
                   (XMLCh *)CONCAT44(extraout_var_32,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
    }
    if ((uVar1 & 0x80) != 0) {
      if ((uVar2 & 0x80) != 0) {
        iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                          (this,pXVar8,pXVar12);
        if (((uVar3 & 0x80) != 0) && (iVar4 != 0)) {
          pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar4 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[6])();
          iVar5 = (*(pXVar12->super_XSerializable)._vptr_XSerializable[6])();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (pIVar14,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,0x287,FACET_minIncl_base_fixed,(XMLCh *)CONCAT44(extraout_var_33,iVar4),
                     (XMLCh *)CONCAT44(extraout_var_34,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
          __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                      InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
        }
        if ((iVar4 == -1) || (iVar4 == 2)) {
          pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          iVar4 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[6])();
          iVar5 = (*(pXVar12->super_XSerializable)._vptr_XSerializable[6])();
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (pIVar14,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                     ,0x28f,FACET_minIncl_base_minIncl,(XMLCh *)CONCAT44(extraout_var_35,iVar4),
                     (XMLCh *)CONCAT44(extraout_var_36,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
          __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                      InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
        }
      }
      if (((uVar2 & 0x20) != 0) &&
         ((iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                             (this,pXVar8,pXVar10), iVar4 == 1 || (iVar4 == 2)))) {
        pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar4 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[6])();
        iVar5 = (*(pXVar10->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar14,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x29b,FACET_minIncl_base_maxIncl,(XMLCh *)CONCAT44(extraout_var_37,iVar4),
                   (XMLCh *)CONCAT44(extraout_var_38,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      if (((uVar2 & 0x100) != 0) &&
         (iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                            (this,pXVar8,pXVar13), iVar4 != 1)) {
        pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar4 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[6])();
        iVar5 = (*(pXVar13->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar14,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x2a7,FACET_minIncl_base_minExcl,(XMLCh *)CONCAT44(extraout_var_39,iVar4),
                   (XMLCh *)CONCAT44(extraout_var_40,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
      if (((uVar2 & 0x40) != 0) &&
         (iVar4 = (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x10])
                            (this,pXVar8,pXVar11), iVar4 != -1)) {
        pIVar14 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
        iVar4 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[6])();
        iVar5 = (*(pXVar11->super_XSerializable)._vptr_XSerializable[6])();
        InvalidDatatypeFacetException::InvalidDatatypeFacetException
                  (pIVar14,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/AbstractNumericFacetValidator.cpp"
                   ,0x2b3,FACET_minIncl_base_maxExcl,(XMLCh *)CONCAT44(extraout_var_41,iVar4),
                   (XMLCh *)CONCAT44(extraout_var_42,iVar5),(XMLCh *)0x0,(XMLCh *)0x0,manager);
        __cxa_throw(pIVar14,&InvalidDatatypeFacetException::typeinfo,
                    InvalidDatatypeFacetException::~InvalidDatatypeFacetException);
      }
    }
    (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0xf])(this,manager);
    if (((uVar1 & 0x10) != 0) && (this->fStrEnumeration != (RefArrayVectorOf<char16_t> *)0x0)) {
      (*(this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x16])(this,manager)
      ;
    }
    if ((uVar1 & 0x20) != 0) {
      iVar4 = (*(pXVar6->super_XSerializable)._vptr_XSerializable[5])();
      (*(this_00->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x11])
                (this_00,CONCAT44(extraout_var_43,iVar4),0,0,manager);
    }
    if ((uVar1 & 0x80) != 0) {
      iVar4 = (*(pXVar8->super_XSerializable)._vptr_XSerializable[5])();
      (*(this_00->super_DatatypeValidator).super_XSerializable._vptr_XSerializable[0x11])
                (this_00,CONCAT44(extraout_var_44,iVar4),0,0,manager);
    }
  }
  return;
}

Assistant:

void AbstractNumericFacetValidator::inspectFacetBase(MemoryManager* const manager)
{

    AbstractNumericFacetValidator* numBase = (AbstractNumericFacetValidator*) getBaseValidator();
    int thisFacetsDefined = getFacetsDefined();

    if ( (!thisFacetsDefined && !fEnumeration) ||
         !numBase           )
        return;

    int baseFacetsDefined = numBase->getFacetsDefined();

    XMLNumber *thisMaxInclusive = getMaxInclusive();
    XMLNumber *thisMaxExclusive = getMaxExclusive();
    XMLNumber *thisMinInclusive = getMinInclusive();
    XMLNumber *thisMinExclusive = getMinExclusive();

    XMLNumber *baseMaxInclusive = numBase->getMaxInclusive();
    XMLNumber *baseMaxExclusive = numBase->getMaxExclusive();
    XMLNumber *baseMinInclusive = numBase->getMinInclusive();
    XMLNumber *baseMinExclusive = numBase->getMinExclusive();
    int       baseFixed = numBase->getFixed();

                //                                     this
                //                 minExclusive                          maxExclusive
                //                    minInclusive                  maxInclusive
                //
                //                                     base
                //  minExclusive                                                          maxExclusive
                //      minInclusive                                                   maxInclusive
                //

    // check 4.3.7.c2 error:
    // maxInclusive > base.maxInclusive && maxInclusive != base.maxInclusive if (base.fixed)
    // maxInclusive >= base.maxExclusive
    // maxInclusive < base.minInclusive
    // maxInclusive <= base.minExclusive

    if ((thisFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0)
    {
        if ((baseFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxInclusive, baseMaxInclusive);

            if (((baseFixed & DatatypeValidator::FACET_MAXINCLUSIVE) != 0) &&
                 (result != 0 ))
            {
                REPORT_FACET_ERROR(thisMaxInclusive
                                 , baseMaxInclusive
                                 , XMLExcepts::FACET_maxIncl_base_fixed
                                 , manager)
            }

            if (result == 1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMaxInclusive
                                 , baseMaxInclusive
                                 , XMLExcepts::FACET_maxIncl_base_maxIncl
                                 , manager)
            }

        }

        if ((baseFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxInclusive, baseMaxExclusive);
            if (result != -1 )
            {
                REPORT_FACET_ERROR(thisMaxInclusive
                                 , baseMaxExclusive
                                 , XMLExcepts::FACET_maxIncl_base_maxExcl
                                 , manager)
            }
        }


        if ((baseFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxInclusive, baseMinInclusive);
            if (result == -1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMaxInclusive
                                 , baseMinInclusive
                                 , XMLExcepts::FACET_maxIncl_base_minIncl
                                 , manager)
            }
        }

        if ((baseFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxInclusive, baseMinExclusive);
            if (result != 1 )
            {
                REPORT_FACET_ERROR(thisMaxInclusive
                                 , baseMinExclusive
                                 , XMLExcepts::FACET_maxIncl_base_minExcl
                                 , manager)
            }
        }

    }

    // check 4.3.8.c3 error:
    // maxExclusive > base.maxExclusive  && maxExclusive != base.maxExclusive if (base.fixed)
    // maxExclusive > base.maxInclusive
    // maxExclusive <= base.minInclusive
    // maxExclusive <= base.minExclusive

    if ((thisFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0)
    {
        if (( baseFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxExclusive, baseMaxExclusive);

            if (((baseFixed & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0) &&
                 (result != 0 ))
            {
                REPORT_FACET_ERROR(thisMaxExclusive
                                 , baseMaxExclusive
                                 , XMLExcepts::FACET_maxExcl_base_fixed
                                 , manager)
             }

            if (result == 1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMaxExclusive
                                 , baseMaxExclusive
                                 , XMLExcepts::FACET_maxExcl_base_maxExcl
                                 , manager)
            }

            /**
             * Schema Errata
             * E2-16 maxExclusive
             *
             *   derived type's maxExclusive must either be
             *   1) equal to base' maxExclusive or
             *   2) from the base type value space
             *
             */
            if (result != 0)
            {
                FROM_BASE_VALUE_SPACE(thisMaxExclusive
                        , DatatypeValidator::FACET_MAXEXCLUSIVE
                        , XMLExcepts::FACET_maxExcl_notFromBase
                        , manager)
            }
        }
        else  // base has no maxExclusive
        {
            FROM_BASE_VALUE_SPACE(thisMaxExclusive
                        , DatatypeValidator::FACET_MAXEXCLUSIVE
                        , XMLExcepts::FACET_maxExcl_notFromBase
                        , manager)
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxExclusive, baseMaxInclusive);
            if (result == 1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMaxExclusive
                                 , baseMaxInclusive
                                 , XMLExcepts::FACET_maxExcl_base_maxIncl
                                 , manager)
            }
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxExclusive, baseMinExclusive);
            if (result != 1)
            {
                REPORT_FACET_ERROR(thisMaxExclusive
                                 , baseMinExclusive
                                 , XMLExcepts::FACET_maxExcl_base_minExcl
                                 , manager)
            }
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0)
        {
            int result = compareValues(thisMaxExclusive, baseMinInclusive);
            if (result != 1)
            {
                REPORT_FACET_ERROR(thisMaxExclusive
                                 , baseMinInclusive
                                 , XMLExcepts::FACET_maxExcl_base_minIncl
                                 , manager)
            }
        }
    }

    // check 4.3.9.c3 error:
    // minExclusive < base.minExclusive     minExclusive != base.minExclusive if (base.fixed)
    // minExclusive > base.maxInclusive ??? minExclusive >= base.maxInclusive
    // minExclusive < base.minInclusive
    // minExclusive >= base.maxExclusive

    if ((thisFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0)
    {
        if (( baseFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMinExclusive, baseMinExclusive);

            if (((baseFixed & DatatypeValidator::FACET_MINEXCLUSIVE) != 0) &&
                 (result != 0 ))
            {
                REPORT_FACET_ERROR(thisMinExclusive
                                 , baseMinExclusive
                                 , XMLExcepts::FACET_minExcl_base_fixed
                                 , manager)
            }

            if (result == -1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMinExclusive
                                 , baseMinExclusive
                                 , XMLExcepts::FACET_minExcl_base_minExcl
                                 , manager)
            }

            /**
             * Schema Errata
             * E2-16 maxExclusive
             *
             *   derived type's minExclusive must either be
             *   1) equal to base' minxExclusive or
             *   2) from the base type value space
             *
             *  Note: deduced from, not explicitly expressed in the Errata
             */
            if (result != 0)
            {
                FROM_BASE_VALUE_SPACE(thisMinExclusive
                        , DatatypeValidator::FACET_MINEXCLUSIVE
                        , XMLExcepts::FACET_minExcl_notFromBase
                        , manager)
            }
        }
        else // base has no minExclusive
        {

            FROM_BASE_VALUE_SPACE(thisMinExclusive
                        , DatatypeValidator::FACET_MINEXCLUSIVE
                        , XMLExcepts::FACET_minExcl_notFromBase
                        , manager)
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0)
        {
            int result = compareValues(thisMinExclusive, baseMaxInclusive);
            if (result == 1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMinExclusive
                                 , baseMaxInclusive
                                 , XMLExcepts::FACET_minExcl_base_maxIncl
                                 , manager)
            }
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0)
        {
            int result = compareValues(thisMinExclusive, baseMinInclusive);
            if (result == -1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMinExclusive
                                 , baseMinInclusive
                                 , XMLExcepts::FACET_minExcl_base_minIncl
                                 , manager)
            }
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMinExclusive, baseMaxExclusive);
            if (result != -1)
            {
                REPORT_FACET_ERROR(thisMinExclusive
                                 , baseMaxExclusive
                                 , XMLExcepts::FACET_minExcl_base_maxExcl
                                 , manager)
            }
        }

    }

    // check 4.3.10.c2 error:
    // minInclusive < base.minInclusive   minInclusive != base.minInclusive if (base.fixed)
    // minInclusive > base.maxInclusive
    // minInclusive <= base.minExclusive
    // minInclusive >= base.maxExclusive


    if ((thisFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0)
    {
        if ((baseFacetsDefined & DatatypeValidator::FACET_MININCLUSIVE) != 0)
        {
            int result = compareValues(thisMinInclusive, baseMinInclusive);

            if (((baseFixed & DatatypeValidator::FACET_MININCLUSIVE) != 0) &&
                 (result != 0 ))
            {
                REPORT_FACET_ERROR(thisMinInclusive
                                 , baseMinInclusive
                                 , XMLExcepts::FACET_minIncl_base_fixed
                                 , manager)
            }

            if (result == -1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMinInclusive
                                 , baseMinInclusive
                                 , XMLExcepts::FACET_minIncl_base_minIncl
                                 , manager)
            }
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MAXINCLUSIVE) != 0)
        {
            int result = compareValues(thisMinInclusive, baseMaxInclusive);
            if (result == 1 || result == INDETERMINATE)
            {
                REPORT_FACET_ERROR(thisMinInclusive
                                 , baseMaxInclusive
                                 , XMLExcepts::FACET_minIncl_base_maxIncl
                                 , manager)
            }
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MINEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMinInclusive, baseMinExclusive);
            if (result != 1)
            {
                REPORT_FACET_ERROR(thisMinInclusive
                                 , baseMinExclusive
                                 , XMLExcepts::FACET_minIncl_base_minExcl
                                 , manager)
            }
        }

        if (( baseFacetsDefined & DatatypeValidator::FACET_MAXEXCLUSIVE) != 0)
        {
            int result = compareValues(thisMinInclusive, baseMaxExclusive);
            if (result != -1)
            {
                REPORT_FACET_ERROR(thisMinInclusive
                                 , baseMaxExclusive
                                 , XMLExcepts::FACET_minIncl_base_maxExcl
                                 , manager)
            }
        }

    }

    checkAdditionalFacetConstraintsBase(manager);

    // check 4.3.5.c0 must: enumeration values from the value space of base
    //
    // In fact, the values in the enumeration shall go through validation
    // of this class as well.
    // this->checkContent(value, false);
    //
    if ( ((thisFacetsDefined & DatatypeValidator::FACET_ENUMERATION) != 0) &&
        ( fStrEnumeration ))
    {
        setEnumeration(manager);
    }

    //
    // maxInclusive, maxExclusive, minInclusive and minExclusive
    // shall come from the base's value space as well
    //

    FROM_BASE_VALUE_SPACE(thisMaxInclusive
                        , DatatypeValidator::FACET_MAXINCLUSIVE
                        , XMLExcepts::FACET_maxIncl_notFromBase
                        , manager)

    FROM_BASE_VALUE_SPACE(thisMinInclusive
                        , DatatypeValidator::FACET_MININCLUSIVE
                        , XMLExcepts::FACET_minIncl_notFromBase
                        , manager)

}